

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

sexp_conflict
sexp_immutable_string_op(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict s)

{
  int *in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sexp_conflict res;
  sexp_conflict local_8;
  
  if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 9)) {
    local_8 = (sexp_conflict)sexp_alloc_tagged_aux(in_RDI,0x20,9);
    (local_8->value).flonum = *(double *)(in_RCX + 2);
    (local_8->value).type.cpl = *(sexp *)(in_RCX + 4);
    (local_8->value).type.slots = *(sexp *)(in_RCX + 6);
    *(byte *)((long)in_RCX + 5) = *(byte *)((long)in_RCX + 5) & 0xef | 0x10;
    local_8->field_0x5 = local_8->field_0x5 & 0xfe | 1;
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,9,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_immutable_string_op (sexp ctx, sexp self, sexp_sint_t n, sexp s) {
  sexp res;
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, s);
#if SEXP_USE_PACKED_STRINGS
  /* no sharing with packed strings */
  res = sexp_c_string(ctx, sexp_string_data(s), sexp_string_size(s));
#else
  res = sexp_alloc_type(ctx, string, SEXP_STRING);
  sexp_string_bytes(res) = sexp_string_bytes(s);
  sexp_string_offset(res) = sexp_string_offset(s);
  sexp_string_size(res) = sexp_string_size(s);
  sexp_copy_on_writep(s) = 1;
#endif
  sexp_immutablep(res) = 1;
  return res;
}